

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O1

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
expand(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
      SearchVertexPtr *vertex)

{
  Heap<double> *this_00;
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pHVar4;
  SearchVertexPtr *pSVar5;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *pAVar6;
  int iVar7;
  iterator iVar8;
  long lVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  long lVar11;
  long lVar12;
  pointer psVar13;
  double dVar14;
  double dVar15;
  SearchVertexPtr vertex_copy;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  vertex_successors;
  undefined1 local_149;
  double local_148;
  SearchVertexPtr *local_140;
  Heap<double> *local_138;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *local_130;
  value_type local_128;
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  *local_118;
  Ptr local_110;
  Ptr local_100;
  Ptr local_f0;
  Ptr local_e0;
  Ptr local_d0;
  Ptr local_c0;
  Ptr local_b0;
  Ptr local_a0;
  _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_90;
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  *local_88;
  _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_78;
  double local_70;
  undefined1 local_68 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar1 = (vertex->
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((peVar1->super_Element).heap_index_ != -1) {
    this_00 = &(this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).open_;
    local_a0.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (vertex->
         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
         )._M_refcount._M_pi;
    if (local_a0.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.
         super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.
         super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_a0.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = &peVar1->super_Element;
    csbpl_common::Heap<double>::decreaseKey(this_00,&local_a0,-INFINITY);
    if (local_a0.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    csbpl_common::Heap<double>::remove((Heap<double> *)(local_68 + 0x28),(char *)this_00);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    (((vertex->
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr)->super_Element).key_ = INFINITY;
  }
  local_140 = vertex;
  if (0 < (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.num_inad_) {
    lVar11 = 0;
    lVar9 = 0;
    lVar12 = 0;
    do {
      psVar2 = (((local_140->
                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->mha_copy_).
               super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar3 = *(element_type **)
                ((long)&psVar2->
                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                + lVar9);
      if (peVar3->heap_index_ != -1) {
        pHVar4 = (this->open_inad_).
                 super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_b0.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&psVar2->
                      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              + lVar9 + 8);
        if (local_b0.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b0.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_b0.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b0.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_b0.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_b0.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar3;
        csbpl_common::Heap<double>::decreaseKey
                  ((Heap<double> *)
                   ((long)&(pHVar4->data_).
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl + lVar11),&local_b0,-INFINITY);
        if (local_b0.
            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        csbpl_common::Heap<double>::remove
                  ((Heap<double> *)local_68,
                   (char *)((long)&(((this->open_inad_).
                                     super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->data_).
                                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                   ._M_impl + lVar11));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
        **(undefined8 **)
          ((long)&((((local_140->
                     super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->mha_copy_).
                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
          + lVar9) = 0x7ff0000000000000;
      }
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0x10;
      lVar11 = lVar11 + 0x18;
    } while (lVar12 < (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.num_inad_);
  }
  pSVar5 = local_140;
  sliding_puzzle::SlidingPuzzle::getValidSuccessors
            ((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              *)(local_68 + 0x10),
             (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).env_ptr_.
             super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_140);
  local_78 = &(pSVar5->
              super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount;
  local_80 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).closed_._M_h;
  local_88 = &this->incons_;
  local_118 = &this->incons_inad_;
  local_138 = &(this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).open_;
  local_90 = &(this->closed_inad_)._M_h;
  psVar13 = (pointer)local_68._16_8_;
  local_130 = this;
  do {
    peVar3 = (psVar13->
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((peVar3[3].key_ == *(double *)&peVar3[3].heap_index_) &&
       (0 < (local_130->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).params_.num_inad_)) {
      lVar9 = 0;
      lVar11 = 0;
      do {
        local_128.
        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
                  (&local_128.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(Vertex<sliding_puzzle::SlidingPuzzleState,_double> **)&local_128,
                   (allocator<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                   &local_149,
                   (shared_ptr<sliding_puzzle::SlidingPuzzleState> *)
                   ((psVar13->
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr + 1));
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     *)((psVar13->
                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + 3),&local_128);
        peVar3 = (psVar13->
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        lVar12 = *(long *)((long)peVar3[3].key_ + lVar9);
        *(element_type **)(lVar12 + 0x48) = peVar3;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar12 + 0x50),
                   &(psVar13->
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
        if (local_128.
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.
                     super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar11 < (local_130->
                        super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                        ).params_.num_inad_);
    }
    pAVar6 = local_130;
    pSVar5 = local_140;
    peVar1 = (local_140->
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    dVar15 = peVar1->g_cost_;
    iVar7 = sliding_puzzle::SlidingPuzzle::getCostToSuccessor
                      ((local_130->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                       ).env_ptr_.
                       super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&peVar1->state_,
                       (SlidingPuzzleStatePtr *)
                       ((psVar13->
                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + 1));
    dVar15 = dVar15 + (double)iVar7;
    peVar3 = (psVar13->
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (dVar15 < *(double *)&peVar3[6].heap_index_) {
      *(double *)&peVar3[6].heap_index_ = dVar15;
      peVar3[2].key_ =
           (double)(pSVar5->
                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&peVar3[2].heap_index_,local_78);
      peVar3 = (psVar13->
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      peVar3[8].heap_index_ =
           ((pSVar5->
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->root_id_;
      *(int *)&peVar3[8].field_0xc = *(int *)((long)peVar3[2].key_ + 0x8c) + 1;
      iVar8 = std::
              _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_80,(key_type *)(peVar3 + 1));
      peVar3 = (psVar13->
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
          ._M_cur == (__node_type *)0x0) {
        dVar15 = *(double *)&peVar3[6].heap_index_;
        local_148 = (pAVar6->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.eps_;
        dVar14 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost
                           ((pAVar6->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(SlidingPuzzleStatePtr *)(peVar3 + 1));
        local_148 = local_148 * dVar14 + dVar15;
        peVar3 = (psVar13->
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        peVar3->key_ = INFINITY;
        if (peVar3->heap_index_ == -1) {
          local_c0.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (psVar13->
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_c0.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c0.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c0.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_c0.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = peVar3;
          csbpl_common::Heap<double>::insert(local_138,&local_c0);
          if (local_c0.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          local_d0.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (psVar13->
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
          local_d0.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (psVar13->
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_d0.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d0.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d0.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          csbpl_common::Heap<double>::decreaseKey(local_138,&local_d0,local_148);
          _Var10._M_pi = local_d0.
                         super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
        }
        else {
          local_e0.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (psVar13->
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_e0.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e0.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e0.
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e0.
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e0.
                    super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_e0.
          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = peVar3;
          csbpl_common::Heap<double>::decreaseKey(local_138,&local_e0,local_148);
          _Var10._M_pi = local_e0.
                         super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
        }
        if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
        }
        iVar8 = std::
                _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_90,(key_type *)
                                ((psVar13->
                                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + 1));
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (0 < (pAVar6->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).params_.num_inad_) {
            lVar11 = 8;
            lVar9 = 0;
            lVar12 = 0;
            do {
              peVar3 = (psVar13->
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_70 = *(double *)&peVar3[6].heap_index_;
              dVar15 = (pAVar6->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                       ).params_.eps_;
              dVar14 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                                 ((pAVar6->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_.
                                  super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(SlidingPuzzleStatePtr *)(peVar3 + 1),(int)lVar12);
              dVar15 = dVar15 * dVar14 + local_70;
              if (dVar15 <= (pAVar6->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).params_.mha_eps_ * local_148) {
                dVar14 = (psVar13->
                         super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr[3].key_;
                peVar3 = *(element_type **)((long)dVar14 + -8 + lVar11);
                peVar3->key_ = INFINITY;
                if (peVar3->heap_index_ == -1) {
                  pHVar4 = (pAVar6->open_inad_).
                           super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  local_f0.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)dVar14 + lVar11);
                  if (local_f0.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_f0.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_f0.
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_f0.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_f0.
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  local_f0.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar3;
                  csbpl_common::Heap<double>::insert
                            ((Heap<double> *)
                             ((long)&(pHVar4->data_).
                                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                     ._M_impl + lVar9),&local_f0);
                  if (local_f0.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_f0.
                               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  pHVar4 = (pAVar6->open_inad_).
                           super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar14 = (psVar13->
                           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr[3].key_;
                  local_100.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = *(element_type **)((long)dVar14 + -8 + lVar11);
                  local_100.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)dVar14 + lVar11);
                  if (local_100.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_100.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_100.
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_100.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_100.
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  csbpl_common::Heap<double>::decreaseKey
                            ((Heap<double> *)
                             ((long)&(pHVar4->data_).
                                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                     ._M_impl + lVar9),&local_100,dVar15);
                  _Var10._M_pi = local_100.
                                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                }
                else {
                  pHVar4 = (pAVar6->open_inad_).
                           super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  local_110.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)dVar14 + lVar11);
                  if (local_110.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_110.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_110.
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_110.
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_110.
                            super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  local_110.
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar3;
                  csbpl_common::Heap<double>::decreaseKey
                            ((Heap<double> *)
                             ((long)&(pHVar4->data_).
                                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                     ._M_impl + lVar9),&local_110,dVar15);
                  _Var10._M_pi = local_110.
                                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                }
                if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
                }
              }
              lVar12 = lVar12 + 1;
              lVar11 = lVar11 + 0x10;
              lVar9 = lVar9 + 0x18;
            } while (lVar12 < (pAVar6->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).params_.num_inad_);
          }
        }
        else {
          std::
          vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
          ::push_back(local_118,
                      (value_type *)
                      ((psVar13->
                       super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + 1));
        }
      }
      else {
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::push_back(local_88,(value_type *)(peVar3 + 1));
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::push_back(local_118,
                    (value_type *)
                    ((psVar13->
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr + 1));
      }
    }
    psVar13 = psVar13 + 1;
  } while( true );
}

Assistant:

virtual bool expand(SearchVertexPtr& vertex)
    {
      if (vertex->heap_index_ != -1)
      {
        this->open_.decreaseKey(vertex,
                                -std::numeric_limits<double>::infinity());
        this->open_.remove();
        vertex->key_ = std::numeric_limits<double>::infinity();
      }
      
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        if (vertex->mha_copy_[i]->heap_index_ != -1)
        {
          open_inad_[i].decreaseKey(vertex->mha_copy_[i],
                                    -std::numeric_limits<double>::infinity());
          open_inad_[i].remove();
          vertex->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
        }
      }
      
      std::vector<SearchVertexPtr> vertex_successors =
        this->env_ptr_->getValidSuccessors(vertex);
      
      for(const SearchVertexPtr &successor : vertex_successors)
      {
        if (successor->mha_copy_.empty())
        {
          for (int i=0; i<this->params_.num_inad_; ++i)
          {
            SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(successor->state_);
            successor->mha_copy_.push_back(vertex_copy);
            successor->mha_copy_[i]->self_ptr_ = successor;
          }
        }
        
        double new_cost = vertex->g_cost_ +
                          this->env_ptr_->getCostToSuccessor(vertex->state_,
                                                             successor->state_);
        
        if (new_cost < successor->g_cost_)
        {
          successor->g_cost_ = new_cost;
          successor->parent_vertex_ = vertex;
          successor->root_id_ = vertex->root_id_;
          successor->depth_ = successor->parent_vertex_->depth_ + 1;
          
          if (this->closed_.find(successor->state_) != this->closed_.end())
          {
            incons_.push_back(successor->state_);
            incons_inad_.push_back(successor->state_);
          }
          else
          {
            // Insert/Update in OPEN_0 with admissible heuristic
            double f_cost_ad = successor->g_cost_ +
                               this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(successor->state_);
            if (successor->heap_index_ == -1)
            {
              successor->key_ = std::numeric_limits<double>::infinity();
              this->open_.insert(successor);
              this->open_.decreaseKey(successor,
                                      f_cost_ad);
            }
            else
            {
              successor->key_ = std::numeric_limits<double>::infinity();
              this->open_.decreaseKey(successor,
                                      f_cost_ad);
            }
            
            if (closed_inad_.find(successor->state_) != closed_inad_.end())
            {
              incons_inad_.push_back(successor->state_);
            }
            else
            {
              for (int i=0; i<this->params_.num_inad_; ++i)
              {
                double f_cost_inad = successor->g_cost_ +
                                     this->params_.eps_*
                                     this->env_ptr_->getInadmissibleHeuristicCost(successor->state_, i);
                
                if (f_cost_inad <= this->params_.mha_eps_*f_cost_ad)
                {
                  if (successor->mha_copy_[i]->heap_index_ == -1)
                  {
                    successor->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
                    open_inad_[i].insert(successor->mha_copy_[i]);
                    open_inad_[i].decreaseKey(successor->mha_copy_[i],
                                              f_cost_inad);
                  }
                  else
                  {
                    successor->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
                    open_inad_[i].decreaseKey(successor->mha_copy_[i],
                                              f_cost_inad);
                  }
                }
              }
            }
          }
        }
      }
    }